

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::SetupCustomTargets(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  bool local_81;
  string local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string emsg;
  cmQtAutoGenInitializer *this_local;
  
  emsg.field_2._8_8_ = this;
  bVar1 = cmsys::SystemTools::MakeDirectory(&(this->Dir).Info,(mode_t *)0x0);
  if (bVar1) {
    bVar1 = MocOrUicEnabled(this);
    if ((!bVar1) || (bVar1 = SetupWriteAutogenInfo(this), bVar1)) {
      local_81 = true;
      if (((this->Rcc).super_GenVarsT.Enabled & 1U) != 0) {
        local_81 = SetupWriteRccInfo(this);
      }
      this_local._7_1_ = local_81;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"AutoGen: Could not create directory: ",&local_39);
    std::allocator<char>::~allocator(&local_39);
    cmQtAutoGen::Quoted(&local_70,&(this->Dir).Info);
    std::__cxx11::string::operator+=((string *)local_38,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmSystemTools::Error((string *)local_38);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenInitializer::SetupCustomTargets()
{
  // Create info directory on demand
  if (!cmSystemTools::MakeDirectory(this->Dir.Info)) {
    std::string emsg = ("AutoGen: Could not create directory: ");
    emsg += Quoted(this->Dir.Info);
    cmSystemTools::Error(emsg);
    return false;
  }

  // Generate autogen target info file
  if (this->MocOrUicEnabled()) {
    // Write autogen target info files
    if (!this->SetupWriteAutogenInfo()) {
      return false;
    }
  }

  // Write AUTORCC info files
  return !this->Rcc.Enabled || this->SetupWriteRccInfo();
}